

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateSubDataTest::iterate(InvalidateSubDataTest *this)

{
  code *pcVar1;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar6;
  value_type vVar7;
  int iVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  ContextInfo *this_00;
  size_type sVar11;
  reference pvVar12;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  undefined4 *puVar13;
  int local_218;
  int local_214;
  GLint i_4;
  GLint i_3;
  int local_90;
  uint local_8c;
  GLint i_2;
  GLuint i_1;
  GLint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> color_attachments;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderbuffers;
  GLint max_color_attachments;
  GLuint framebuffer;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  InvalidateSubDataTest *this_local;
  long lVar10;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar4 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar3) || (bVar4)) {
    renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
    (**(code **)(lVar10 + 0x868))
              (0x8cdf,&renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7af);
    sVar11 = (size_type)
             (int)(GLuint)renderbuffers.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_int>::allocator(&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar11,&local_51);
    std::allocator<unsigned_int>::~allocator(&local_51);
    sVar11 = (size_type)
             (int)(GLuint)renderbuffers.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,sVar11,
               (allocator<unsigned_int> *)((long)&i_1 + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
    for (i_2 = 0; i_2 < (int)(GLuint)renderbuffers.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        i_2 = i_2 + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(long)i_2
                          );
      *pvVar12 = 0;
      vVar7 = i_2 + 0x8ce0;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)i_2);
      *pvVar12 = vVar7;
    }
    (**(code **)(lVar10 + 0xc48))(0,3,iterate::default_attachments,0,0,1,1);
    max_color_attachments._2_1_ = CheckErrorAndLog(this,iterate::default_attachments,3);
    for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
      (**(code **)(lVar10 + 0xc48))(0,1,iterate::default_attachments + local_8c,0,0,1,1);
      bVar3 = CheckErrorAndLog(this,iterate::default_attachments[local_8c]);
      max_color_attachments._2_1_ = (max_color_attachments._2_1_ & bVar3) != 0;
    }
    (**(code **)(lVar10 + 0x6d0))
              (1,(undefined1 *)
                 ((long)&renderbuffers.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7ca);
    (**(code **)(lVar10 + 0x78))
              (0x8d40,renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7cd);
    GVar2 = (GLuint)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar1 = *(code **)(lVar10 + 0x6e8);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
    (*pcVar1)(GVar2,pvVar12);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGenRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,2000);
    for (local_90 = 0;
        local_90 <
        (int)(GLuint)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; local_90 = local_90 + 1) {
      pcVar1 = *(code **)(lVar10 + 0xa0);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_90);
      (*pcVar1)(0x8d41,*pvVar12);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x7d6);
      (**(code **)(lVar10 + 0x1238))(0x8d41,0x8814,4);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x7d9);
      pcVar1 = *(code **)(lVar10 + 0x688);
      iVar5 = local_90 + 0x8ce0;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_90);
      (*pcVar1)(0x8d40,iVar5,0x8d41,*pvVar12);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glFramebufferRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x7dc);
    }
    iVar8 = (**(code **)(lVar10 + 0x170))(0x8d40);
    iVar5 = renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    GVar2 = (GLuint)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar8 != 0x8cd5) {
      this_01 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_02 = tcu::TestContext::getLog(this_01);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&i_4,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      this_03 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&i_4,
                           (char (*) [40])"Framebuffer is unexpectedly incomplete.");
      tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_4);
      puVar13 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar13 = 0;
      __cxa_throw(puVar13,&int::typeinfo,0);
    }
    pcVar1 = *(code **)(lVar10 + 0xc48);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    (*pcVar1)(iVar5,GVar2,pvVar12,1,1,2,2);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    bVar3 = CheckErrorAndLog(this,pvVar12,
                             (GLuint)renderbuffers.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = (bool)(max_color_attachments._2_1_ & bVar3);
    for (local_214 = 0;
        iVar5 = renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        max_color_attachments._2_1_ = bVar3 != false,
        local_214 <
        (int)(GLuint)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; local_214 = local_214 + 1) {
      pcVar1 = *(code **)(lVar10 + 0xc48);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_214
                          );
      (*pcVar1)(iVar5,1,pvVar12,1,1,2,2);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_214
                          );
      bVar3 = CheckErrorAndLog(this,*pvVar12);
      bVar3 = max_color_attachments._2_1_ && bVar3;
    }
    if (renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      (**(code **)(lVar10 + 0x440))(1);
      renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    for (local_218 = 0;
        local_218 <
        (int)(GLuint)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; local_218 = local_218 + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_218);
      if (*pvVar12 != 0) {
        pcVar1 = *(code **)(lVar10 + 0x460);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(long)local_218);
        (*pcVar1)(1);
      }
    }
    do {
      iVar5 = (**(code **)(lVar10 + 0x800))();
    } while (iVar5 != 0);
    if (max_color_attachments._2_1_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidateSubDataTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	glw::GLuint framebuffer = 0;

	/* Get number of color attachments. */
	glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	std::vector<glw::GLuint> renderbuffers(max_color_attachments);
	std::vector<glw::GLuint> color_attachments(max_color_attachments);
	static const glw::GLenum default_attachments[]	 = { GL_COLOR, GL_DEPTH, GL_STENCIL };
	static const glw::GLuint default_attachments_count = sizeof(default_attachments) / sizeof(default_attachments[0]);

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		renderbuffers[i]	 = 0;
		color_attachments[i] = GL_COLOR_ATTACHMENT0 + i;
	}

	try
	{
		/* Invalidate Default Framebuffer data */
		gl.invalidateNamedFramebufferSubData(0, default_attachments_count, &(default_attachments[0]), 0, 0, 1, 1);
		is_ok &= CheckErrorAndLog(default_attachments, default_attachments_count);

		for (glw::GLuint i = 0; i < default_attachments_count; ++i)
		{
			gl.invalidateNamedFramebufferSubData(0, 1, &(default_attachments[i]), 0, 0, 1, 1);
			is_ok &= CheckErrorAndLog(default_attachments[i]);
		}

		/* Prepare framebuffer... */
		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genRenderbuffers(max_color_attachments, &(renderbuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		/* .. with renderbuffer color attachments. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 4, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}

		gl.invalidateNamedFramebufferSubData(framebuffer, max_color_attachments, &(color_attachments[0]), 1, 1, 2, 2);
		is_ok &= CheckErrorAndLog(&(color_attachments[0]), max_color_attachments);

		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.invalidateNamedFramebufferSubData(framebuffer, 1, &(color_attachments[i]), 1, 1, 2, 2);
			is_ok &= CheckErrorAndLog(color_attachments[i]);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);

		framebuffer = 0;
	}

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		if (renderbuffers[i])
		{
			gl.deleteRenderbuffers(1, &(renderbuffers[i]));
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}